

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O2

bool __thiscall
ObjectModelBuilder::buildMaybeFunction(ObjectModelBuilder *this,value *value,Class *clazz)

{
  int iVar1;
  string *input;
  ostream *poVar2;
  string local_48;
  
  iVar1 = value->type_;
  if (iVar1 == 3) {
    input = picojson::value::get<std::__cxx11::string>(value);
    string_trim(&local_48,input);
    buildFunction(this,&local_48,clazz);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"error: function in class=\'");
    poVar2 = std::operator<<(poVar2,(string *)clazz);
    poVar2 = std::operator<<(poVar2,"\' is not a JSON string..");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return iVar1 == 3;
}

Assistant:

bool ObjectModelBuilder::buildMaybeFunction(const picojson::value &value, Class *clazz)
{
    if (!value.is<std::string>()) {
        std::cerr << "error: function in class='" << clazz->name << "' is not a JSON string.." << std::endl;
        return false;
    }
    return buildFunction(string_trim(value.get<std::string>()), clazz);
}